

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

bool __thiscall
ON_SimpleArray<ON_Value_*>::Sort
          (ON_SimpleArray<ON_Value_*> *this,sort_algorithm sa,int *index,
          _func_int_ON_Value_ptr_ptr_ON_Value_ptr_ptr *compar)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = false;
  if (((this->m_a != (ON_Value **)0x0) && (index != (int *)0x0)) &&
     (compar != (_func_int_ON_Value_ptr_ptr_ON_Value_ptr_ptr *)0x0)) {
    uVar1 = this->m_count;
    bVar2 = false;
    if (0 < (int)uVar1) {
      if (uVar1 < 2) {
        *index = 0;
        return true;
      }
      ON_Sort(sa,index,this->m_a,(ulong)uVar1,8,(_func_int_void_ptr_void_ptr *)compar);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool ON_SimpleArray<T>::Sort( ON::sort_algorithm sa, int* index, int (*compar)(const T*,const T*) ) const
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar && index ) {
    if ( m_count > 1 )
      ON_Sort(sa, index, m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    else if ( m_count == 1 )
      index[0] = 0;
    rc = true;
  }
  return rc;
}